

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::State::SkipWithError(State *this,char *msg)

{
  long in_RSI;
  undefined1 *in_RDI;
  error_message_type expected_no_error_msg;
  char *in_stack_ffffffffffffffc8;
  __pointer_type in_stack_ffffffffffffffd0;
  __pointer_type *in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  byte bVar1;
  CheckHandler local_18 [3];
  
  bVar1 = 0;
  if (in_RSI == 0) {
    internal::CheckHandler::CheckHandler
              ((CheckHandler *)(ulong)in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20));
    bVar1 = 1;
    internal::CheckHandler::GetLog(local_18);
  }
  else {
    internal::GetNullLogInstance();
  }
  if ((bVar1 & 1) == 0) {
    in_RDI[0x3c] = 1;
    std::atomic<const_char_*>::compare_exchange_weak
              ((atomic<const_char_*> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,memory_order_relaxed);
    in_RDI[1] = 1;
    *in_RDI = 1;
    *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x48);
    std::
    unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
    ::operator->((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  *)0x167f01);
    anon_unknown_1::TimerManager::RemoveErroredThread
              ((TimerManager *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
    return;
  }
  internal::CheckHandler::~CheckHandler((CheckHandler *)&LAB_00167e9d);
}

Assistant:

void State::SkipWithError(const char* msg) {
  CHECK(msg);
  error_occurred_ = true;
  error_message_type expected_no_error_msg = nullptr;
  error_message.compare_exchange_weak(expected_no_error_msg,
    const_cast<error_message_type>(msg));
  started_ = finished_ = true;
  total_iterations_ = max_iterations;
  timer_manager->RemoveErroredThread();
}